

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeKernelSetGroupSize
          (ze_kernel_handle_t hKernel,uint32_t groupSizeX,uint32_t groupSizeY,uint32_t groupSizeZ)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  ulong uVar8;
  ze_result_t unaff_R15D;
  bool bVar9;
  ze_result_t local_8c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeKernelSetGroupSize(hKernel, groupSizeX, groupSizeY, groupSizeZ)",
             "");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(context + 0x570);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(context + 0xd30);
    lVar4 = *(long *)(context + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_8c = unaff_R15D;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        local_8c = (**(code **)(*plVar5 + 0x740))(plVar5,hKernel,groupSizeX,groupSizeY,groupSizeZ);
        if (local_8c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeKernelSetGroupSize",local_8c);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = uVar8 + (-(ulong)(uVar7 == 0) - uVar7);
        uVar8 = uVar8 + 1;
        local_8c = unaff_R15D;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_8c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeKernelSetGroupSizePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hKernel,groupSizeX,
                           groupSizeY,groupSizeZ), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeKernelSetGroupSize",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hKernel,groupSizeX,groupSizeY,groupSizeZ);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 0x748))
                           (plVar5,hKernel,groupSizeX,groupSizeY,groupSizeZ,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeKernelSetGroupSize",result);
          local_8c = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar2 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_8c;
    }
  }
  logAndPropagateResult("zeKernelSetGroupSize",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetGroupSize(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t groupSizeX,                            ///< [in] group size for X dimension to use for this kernel
        uint32_t groupSizeY,                            ///< [in] group size for Y dimension to use for this kernel
        uint32_t groupSizeZ                             ///< [in] group size for Z dimension to use for this kernel
        )
    {
        context.logger->log_trace("zeKernelSetGroupSize(hKernel, groupSizeX, groupSizeY, groupSizeZ)");

        auto pfnSetGroupSize = context.zeDdiTable.Kernel.pfnSetGroupSize;

        if( nullptr == pfnSetGroupSize )
            return logAndPropagateResult("zeKernelSetGroupSize", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelSetGroupSizePrologue( hKernel, groupSizeX, groupSizeY, groupSizeZ );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeKernelSetGroupSizePrologue( hKernel, groupSizeX, groupSizeY, groupSizeZ );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }

        auto driver_result = pfnSetGroupSize( hKernel, groupSizeX, groupSizeY, groupSizeZ );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeKernelSetGroupSizeEpilogue( hKernel, groupSizeX, groupSizeY, groupSizeZ ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeKernelSetGroupSize", result);
        }

        return logAndPropagateResult("zeKernelSetGroupSize", driver_result);
    }